

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::Base64EncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  unsigned_long length;
  char *pcVar1;
  ulong local_268;
  size_t i;
  size_t local_258;
  size_t rlen;
  uchar *encoded_buffer;
  uchar *local_238;
  uchar *file_buffer;
  ifstream ifs;
  size_t len;
  string *file_local;
  cmCTest *this_local;
  string *base64;
  
  length = cmsys::SystemTools::FileLength(file);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&file_buffer,pcVar1,_S_in);
  local_238 = (uchar *)operator_new__(length + 1);
  std::istream::read((char *)&file_buffer,(long)local_238);
  std::ifstream::close();
  rlen = (size_t)operator_new__((length * 3 >> 1) + 5);
  local_258 = cmsysBase64_Encode(local_238,length,(uchar *)rlen,1);
  i._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)((long)&i + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 6));
  for (local_268 = 0; local_268 < local_258; local_268 = local_268 + 1) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*(char *)(rlen + local_268));
  }
  if (local_238 != (uchar *)0x0) {
    operator_delete__(local_238);
  }
  if (rlen != 0) {
    operator_delete__((void *)rlen);
  }
  i._7_1_ = 1;
  std::ifstream::~ifstream(&file_buffer);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64EncodeFile(std::string file)
{
  size_t const len = cmSystemTools::FileLength(file);
  cmsys::ifstream ifs(file.c_str(), std::ios::in
#ifdef _WIN32
    | std::ios::binary
#endif
    );
  unsigned char *file_buffer = new unsigned char [ len + 1 ];
  ifs.read(reinterpret_cast<char*>(file_buffer), len);
  ifs.close();

  unsigned char *encoded_buffer
    = new unsigned char [ (len * 3) / 2 + 5 ];

  size_t const rlen
    = cmsysBase64_Encode(file_buffer, len, encoded_buffer, 1);

  std::string base64 = "";
  for(size_t i = 0; i < rlen; i++)
    {
    base64 += encoded_buffer[i];
    }
  delete [] file_buffer;
  delete [] encoded_buffer;

  return base64;
}